

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::PixelFilter::writeTo(PixelFilter *this,BinaryWriter *binary)

{
  BinaryWriter *in_RDI;
  int filterType;
  float *in_stack_ffffffffffffffd8;
  
  BinaryWriter::write<int>(in_RDI,(int *)in_stack_ffffffffffffffd8);
  BinaryWriter::write<float>(in_RDI,in_stack_ffffffffffffffd8);
  BinaryWriter::write<float>(in_RDI,in_stack_ffffffffffffffd8);
  return 0x50;
}

Assistant:

int PixelFilter::writeTo(BinaryWriter &binary)  {
    int filterType = static_cast<int>(type);
    binary.write(filterType);
    binary.write(radius);
    binary.write(alpha);
    return TYPE_PIXEL_FILTER;
}